

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

void message_flush(game_event_type unused,game_event_data *data,void *user)

{
  int local_28;
  wchar_t local_24;
  wchar_t h;
  wchar_t w;
  void *user_local;
  game_event_data *data_local;
  game_event_type unused_local;
  
  if (!msg_flag) {
    message_column = L'\0';
  }
  if (message_column != L'\0') {
    if (Term != (term *)0x0) {
      _h = user;
      user_local = data;
      data_local._4_4_ = unused;
      Term_get_size(&local_24,&local_28);
      while (local_24 + L'\xfffffff8' < message_column) {
        msg_flush_split_existing(local_24,&message_column);
      }
      if (message_column != L'\0') {
        msg_flush(message_column);
      }
    }
    msg_flag = false;
    message_column = L'\0';
  }
  return;
}

Assistant:

void message_flush(game_event_type unused, game_event_data *data, void *user)
{
	/* Hack -- Reset */
	if (!msg_flag) message_column = 0;

	/* Flush when needed */
	if (message_column) {
		/* Print pending messages */
		if (Term) {
			int w, h;

			(void)Term_get_size(&w, &h);
			while (message_column > w - 8) {
				msg_flush_split_existing(w, &message_column);
			}
			if (message_column) {
				msg_flush(message_column);
			}
		}

		/* Forget it */
		msg_flag = false;

		/* Reset */
		message_column = 0;
	}
}